

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_protobuf.h
# Opt level: O0

bool __thiscall
ec::base_protobuf::jump_over(base_protobuf *this,uint8_t **pd,int *len,uint32_t wire_type)

{
  bool bVar1;
  unsigned_long local_40;
  uint64_t v;
  size_t datalen;
  int *piStack_28;
  uint32_t wire_type_local;
  int *len_local;
  uint8_t **pd_local;
  base_protobuf *this_local;
  
  v = 0;
  local_40 = 0;
  datalen._4_4_ = wire_type;
  piStack_28 = len;
  len_local = (int *)pd;
  pd_local = (uint8_t **)this;
  switch(wire_type) {
  case 0:
    bVar1 = get_varint<unsigned_long,void>(this,pd,len,&local_40);
    return bVar1;
  case 1:
    if (*len < 8) {
      return false;
    }
    *pd = *pd + 8;
    *len = *len + -8;
    break;
  case 2:
    bVar1 = get_varint<unsigned_long,void>(this,pd,len,&v);
    if (!bVar1) {
      return false;
    }
    if (*piStack_28 < (int)v) {
      return false;
    }
    *(uint64_t *)len_local = v + *(long *)len_local;
    *piStack_28 = *piStack_28 - (int)v;
    break;
  default:
    this->_lasterr = 2;
    return false;
  case 5:
    if (*len < 4) {
      return false;
    }
    *pd = *pd + 4;
    *len = *len + -4;
  }
  return true;
}

Assistant:

bool jump_over(const uint8_t *&pd, int &len, uint32_t wire_type) //jump over unkown field_number
    {
        size_t datalen = 0;
        uint64_t v = 0;

        switch (wire_type) {
        case pb_varint:
            return get_varint(pd, len, v);
            break;

        case pb_fixed64:
            if (len < 8) {
                return false;
            }

            pd += 8;
            len -= 8;
            break;

        case pb_length_delimited:
            if (!get_varint(pd, len, datalen)) {
                return false;
            }

            if (len < (int)datalen) {
                return false;
            }

            pd += datalen;
            len -= (int)datalen;
            break;

        case pb_fixed32:
            if (len < 4) {
                return false;
            }

            pd += 4;
            len -= 4;
            break;

        default:
            _lasterr = pberr_decode;
            return false;// unkown wire_type
        }

        return true;
    }